

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

string * __thiscall
t_javame_generator::get_enum_class_name_abi_cxx11_
          (string *__return_storage_ptr__,t_javame_generator *this,t_type *type)

{
  t_program *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  allocator local_c1;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  t_program *local_60;
  t_program *program;
  allocator local_41;
  undefined1 local_40 [8];
  string package;
  t_type *type_local;
  t_javame_generator *this_local;
  
  package.field_2._8_8_ = type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this_00 = t_type::get_program((t_type *)package.field_2._8_8_);
  local_60 = this_00;
  if ((this_00 != (t_program *)0x0) &&
     (this_00 != (this->super_t_oop_generator).super_t_generator.program_)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"java",&local_c1);
    t_program::get_namespace(&local_a0,this_00,&local_c0);
    std::operator+(&local_80,&local_a0,".");
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (**(code **)(*(long *)package.field_2._8_8_ + 0x18))();
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,__rhs
                );
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string t_javame_generator::get_enum_class_name(t_type* type) {
  string package = "";
  t_program* program = type->get_program();
  if (program != nullptr && program != program_) {
    package = program->get_namespace("java") + ".";
  }
  return package + type->get_name();
}